

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Ok> *
wasm::WATParser::elem<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  Lexer *this;
  _Uninitialized<wasm::Expression_*,_true> *p_Var1;
  undefined8 *puVar2;
  _Storage<wasm::Expression_*,_true> _Var3;
  size_t sVar4;
  pointer pAVar5;
  optional<wasm::Expression_*> offset;
  bool bVar6;
  _Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
  *table_00;
  undefined8 unaff_R13;
  _Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
  *elems_00;
  Name NVar7;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string local_178;
  string local_158;
  undefined1 local_138 [8];
  MaybeResult<wasm::Name> table;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  size_t local_f0;
  undefined4 local_e7;
  undefined1 uStack_e4;
  undefined3 uStack_e3;
  _Storage<wasm::Expression_*,_true> local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  char *local_d0;
  size_t local_c8;
  _Storage<wasm::Expression_*,_true> local_c0;
  undefined4 local_b4;
  undefined1 local_b0 [8];
  Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> elems;
  Result<wasm::Expression_*> _val_3;
  Result<wasm::Expression_*> _val_1;
  
  this = &ctx->in;
  sVar4 = (ctx->in).pos;
  expected._M_str = "elem";
  expected._M_len = 4;
  bVar6 = Lexer::takeSExprStart(this,expected);
  if (!bVar6) {
    (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x01';
    return __return_storage_ptr__;
  }
  local_f0 = sVar4;
  Lexer::takeID((optional<wasm::Name> *)local_138,this);
  if (table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._8_1_ == '\0') {
    local_d0 = (char *)0x0;
    local_c8 = 0;
  }
  else {
    local_d0 = (char *)table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._M_first
                       ._M_storage.super_IString.str._M_len;
    local_c8 = (size_t)local_138;
  }
  table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ = 1;
  expected_00._M_str = "declare";
  expected_00._M_len = 7;
  _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._39_1_ =
       Lexer::takeKeyword(this,expected_00);
  if ((bool)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._39_1_) {
    local_b4 = 0;
  }
  else {
    maybeTableuse<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_b0,ctx);
    _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ =
         (_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
          *)local_138;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<wasm::Name,_wasm::None,_wasm::Err>_&>
      ::_S_vtable._M_arr
      [(long)(char)elems.val.
                   super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u.
                   _24_1_ + 1]._M_data)
              ((anon_class_8_1_8991fb9c_conflict13 *)
               &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,
               (variant<wasm::Name,_wasm::None,_wasm::Err> *)local_b0);
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_b0);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_b0,
                    (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_138);
    if (elems.val.
        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._24_1_ ==
        '\x02') {
      p_Var1 = &_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first + 1;
      _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = p_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,local_b0,
                 elems.val.
                 super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._0_8_
                 + (long)local_b0);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      if ((_Uninitialized<wasm::Expression_*,_true> *)
          _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ == p_Var1) {
        *puVar2 = CONCAT71(_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                           _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
             _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10)
             = CONCAT71(_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                        _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::Expression_*,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->_M_storage =
           (Expression *)
           _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage;
      _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
           (_Uninitialized<wasm::Expression_*,_true>)(Expression *)0x0;
      _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_ = 0;
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
      _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = p_Var1;
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_b0);
      goto LAB_00bf95ca;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_b0);
    expected_01._M_str = "offset";
    expected_01._M_len = 6;
    bVar6 = Lexer::takeSExprStart(this,expected_01);
    if (bVar6) {
      expr<wasm::WATParser::ParseDefsCtx>((Result<wasm::Expression_*> *)local_b0,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
                      &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,
                      (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_b0);
      if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
        p_Var1 = &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first + 1;
        elems.val.
        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = p_Var1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &elems.val.
                    super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                    .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                    _M_index,
                   _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_,
                   (long)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first.
                         _M_storage +
                   _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
        if ((_Uninitialized<wasm::Expression_*,_true> *)
            elems.val.
            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ ==
            p_Var1) {
          *puVar2 = CONCAT71(_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                             _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_)
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
               _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
               elems.val.
               super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
               .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u +
                    0x10) =
               CONCAT71(_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                        _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
        }
        ((_Uninitialized<wasm::Expression_*,_true> *)
        ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->_M_storage
             = (Expression *)
               _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage;
        _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
             (_Uninitialized<wasm::Expression_*,_true>)(Expression *)0x0;
        _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_ = 0;
        (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
        elems.val.
        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = p_Var1;
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                          &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_b0);
        goto LAB_00bf95ca;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                        &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
      local_c0 = (_Storage<wasm::Expression_*,_true>)local_b0;
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_b0);
      local_b4 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    }
    else {
      sVar4 = this->pos;
      bVar6 = Lexer::takeLParen(this);
      if (bVar6) {
        instr<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Ok> *)local_b0,ctx);
        if (elems.val.
            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._24_1_ !=
            '\x01') {
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,
                          (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_b0);
          if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x02') {
            p_Var1 = &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first + 1;
            elems.val.
            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = p_Var1
            ;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       &elems.val.
                        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        _M_index,
                       _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_,
                       (long)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u.
                             _M_first._M_storage +
                       _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_);
            puVar2 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u +
                     0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
            if ((_Uninitialized<wasm::Expression_*,_true> *)
                elems.val.
                super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ ==
                p_Var1) {
              *puVar2 = CONCAT71(_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u.
                                 _9_7_,_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>
                                       .super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>.
                                       _M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
                   _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   elems.val.
                   super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u +
                        0x10) =
                   CONCAT71(_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                            _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
            }
            ((_Uninitialized<wasm::Expression_*,_true> *)
            ((long)&(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->
            _M_storage = (Expression *)
                         _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first.
                         _M_storage;
            _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
                 (_Uninitialized<wasm::Expression_*,_true>)(Expression *)0x0;
            _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_ = 0;
            (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
            elems.val.
            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = p_Var1
            ;
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                              &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index)
            ;
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                              &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index)
            ;
            ParseDefsCtx::makeExpr
                      ((Result<wasm::Expression_*> *)
                       &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,ctx);
            std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::
            _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
                            &elems.val.
                             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                             ._M_index,
                            (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
                            &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
            if (_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ != '\x01') {
              std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                                &elems.val.
                                 super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 .super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 .
                                 super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                 ._M_index);
              local_c0 = (_Storage<wasm::Expression_*,_true>)
                         _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_;
              std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                                &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>.
                                 _M_index);
              local_b4 = (undefined4)CONCAT71((int7)(sVar4 >> 8),1);
              goto LAB_00bf91fb;
            }
            table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = &local_100;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       &table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_index,
                       elems.val.
                       super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       _32_8_,(long)_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u
                                    ._M_first._M_storage +
                              elems.val.
                              super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                              .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                              ._32_8_);
            puVar2 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u +
                     0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
            if ((undefined1 *)
                table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ == &local_100
               ) {
              *puVar2 = CONCAT71(uStack_ff,local_100);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
                   uStack_f8;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u +
                        0x10) = CONCAT71(uStack_ff,local_100);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8) =
                 local_108;
            local_100 = 0;
            (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
            table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = &local_100;
            std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                              &elems.val.
                               super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                               super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               ._M_index);
            std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                              &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index)
            ;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_b0);
          goto LAB_00bf95ca;
        }
        (ctx->in).pos = sVar4;
        pAVar5 = (ctx->in).annotations.
                 super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ctx->in).annotations.
            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
            ._M_impl.super__Vector_impl_data._M_finish != pAVar5) {
          (ctx->in).annotations.
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish = pAVar5;
        }
        Lexer::skipSpace(this);
        local_b4 = 0;
LAB_00bf91fb:
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_b0);
      }
      else {
        local_b4 = 0;
      }
    }
    if (((char)local_b4 != '\0') && (bVar6 = Lexer::takeRParen(this), !bVar6)) {
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,"expected end of offset expression","");
      Lexer::err((Err *)local_b0,this,&local_178);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      _Var3._M_value =
           (Expression *)
           ((long)&elems.val.
                   super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u + 8
           );
      if (local_b0 == (undefined1  [8])_Var3._M_value) {
        *puVar2 = CONCAT71(elems.val.
                           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           _M_u._9_7_,
                           elems.val.
                           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           _M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
             elems.val.
             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
             super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10)
             = CONCAT71(elems.val.
                        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        _M_u._9_7_,
                        elems.val.
                        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                        _M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8) =
           elems.val.
           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._0_8_;
      elems.val.
      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._0_8_ = 0;
      elems.val.
      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._M_first.
      _M_storage._M_storage[8] = '\0';
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
      local_b0 = (undefined1  [8])_Var3._M_value;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00bf95ca;
    }
  }
  elemlist<wasm::WATParser::ParseDefsCtx>
            ((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> *)
             local_b0,ctx,
             table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01');
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                     *)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,
                    (_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                     *)local_b0);
  if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
    p_Var1 = &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first + 1;
    elems.val.
    super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &elems.val.
                super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_index,
               _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_,
               (long)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first.
                     _M_storage +
               _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
    if ((_Uninitialized<wasm::Expression_*,_true> *)
        elems.val.
        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ == p_Var1) {
      *puVar2 = CONCAT71(_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                         _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
           _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           elems.val.
           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10) =
           CONCAT71(_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                    _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
    }
    ((_Uninitialized<wasm::Expression_*,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->_M_storage =
         (Expression *)
         _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage;
    _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
         (_Uninitialized<wasm::Expression_*,_true>)(Expression *)0x0;
    _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_ = 0;
    (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
    elems.val.
    super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = p_Var1;
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         *)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         *)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
    bVar6 = Lexer::takeRParen(this);
    if (bVar6) {
      if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._39_1_ == '\0') {
        table_00 = (_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                    *)local_138;
        if (table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0') {
          table_00 = (_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                      *)0x0;
        }
        local_e0._M_value = local_c0._M_value;
        uStack_d4 = CONCAT31(uStack_e3,uStack_e4);
        uStack_d8._1_3_ = (undefined3)local_e7;
        uStack_d8 = CONCAT31(uStack_d8._1_3_,(char)local_b4);
        elems_00 = (_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                    *)local_b0;
        if (elems.val.
            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._24_1_ !=
            '\0') {
          elems_00 = (_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                      *)0x0;
        }
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._12_4_ = uStack_d4;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._8_4_ = uStack_d8;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._M_payload._M_value = local_c0._M_value;
        NVar7.super_IString.str._M_str = local_d0;
        NVar7.super_IString.str._M_len = local_c8;
        ParseDefsCtx::addElem
                  ((Result<wasm::Ok> *)
                   &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,ctx,NVar7,
                   (Name *)table_00,offset,
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)elems_00,
                   (Index)local_f0);
        if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
          p_Var1 = &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first + 1;
          elems.val.
          super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = p_Var1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     &elems.val.
                      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                      _M_index,
                     _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_,
                     (long)_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first
                           ._M_storage +
                     _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10
                   );
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
          if ((_Uninitialized<wasm::Expression_*,_true> *)
              elems.val.
              super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
              .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ ==
              p_Var1) {
            *puVar2 = CONCAT71(_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u.
                               _9_7_,_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>.
                                     _M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
                 _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                 elems.val.
                 super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u +
                      0x10) =
                 CONCAT71(_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                          _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
          }
          ((_Uninitialized<wasm::Expression_*,_true> *)
          ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->
          _M_storage = (Expression *)
                       _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first.
                       _M_storage;
          _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
               (_Uninitialized<wasm::Expression_*,_true>)(Expression *)0x0;
          _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_ = 0;
          (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
          elems.val.
          super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._32_8_ = p_Var1;
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
          goto LAB_00bf95be;
        }
      }
      else {
        _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ = 0;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index);
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\0';
    }
    else {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"expected end of element segment","");
      Lexer::err((Err *)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index,this,
                 &local_158);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      p_Var1 = &_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first + 1;
      if ((_Uninitialized<wasm::Expression_*,_true> *)
          _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ == p_Var1) {
        *puVar2 = CONCAT71(_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                           _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x18) =
             _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 0x10)
             = CONCAT71(_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                        _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::Expression_*,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u + 8))->_M_storage =
           (Expression *)
           _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage;
      _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
           (_Uninitialized<wasm::Expression_*,_true>)(Expression *)0x0;
      _val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_ = 0;
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x02';
      _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = p_Var1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_00bf95be:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                       *)local_b0);
LAB_00bf95ca:
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_138);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> elem(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("elem"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  bool isDeclare = false;
  MaybeResult<typename Ctx::TableIdxT> table;
  std::optional<typename Ctx::ExprT> offset;

  if (ctx.in.takeKeyword("declare"sv)) {
    isDeclare = true;
  } else {
    table = maybeTableuse(ctx);
    CHECK_ERR(table);

    if (ctx.in.takeSExprStart("offset")) {
      auto off = expr(ctx);
      CHECK_ERR(off);
      offset = *off;
    } else {
      // This may be an abbreviated offset instruction or it may be the
      // beginning of the elemlist.
      auto beforeLParen = ctx.in.getPos();
      if (ctx.in.takeLParen()) {
        if (auto inst = instr(ctx)) {
          CHECK_ERR(inst);
          auto off = ctx.makeExpr();
          CHECK_ERR(off);
          offset = *off;
        } else {
          // This must be the beginning of the elemlist instead.
          ctx.in.setPos(beforeLParen);
        }
      }
    }
    if (offset && !ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
  }

  // If there is no explicit tableuse, we can use the legacy elemlist format.
  bool legacy = !table;
  auto elems = elemlist(ctx, legacy);
  CHECK_ERR(elems);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of element segment");
  }

  if (isDeclare) {
    CHECK_ERR(ctx.addDeclareElem(name, std::move(*elems), pos));
  } else {
    CHECK_ERR(
      ctx.addElem(name, table.getPtr(), offset, std::move(*elems), pos));
  }

  return Ok{};
}